

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uts.c
# Opt level: O1

void uts_parseParams(int argc,char **argv)

{
  int iVar1;
  tree_t tVar2;
  size_t sVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (1 < argc) {
    uVar5 = 1;
    uVar6 = 2;
    do {
      pcVar4 = argv[uVar6 - 1];
      if (*pcVar4 != '-') goto LAB_00104170;
      if (pcVar4[1] == 'h') {
        uts_helpMessage();
        impl_abort(0);
      }
      else {
        sVar3 = strlen(pcVar4);
        if ((sVar3 != 2) || ((uint)argc <= uVar6)) goto LAB_00104170;
      }
      iVar1 = impl_parseParam(argv[uVar6 - 1],argv[uVar6]);
      if (iVar1 == 0) goto LAB_0010412c;
      switch(argv[uVar6 - 1][1]) {
      case 'a':
        tVar2 = atoi(argv[uVar6]);
        shape_fn = tVar2;
        goto LAB_0010414e;
      case 'b':
        b_0 = atof(argv[uVar6]);
        break;
      default:
        iVar1 = (int)uVar5;
        goto LAB_00104127;
      case 'd':
        gen_mx = atoi(argv[uVar6]);
        break;
      case 'f':
        shiftDepth = atof(argv[uVar6]);
        break;
      case 'g':
        computeGranularity = atoi(argv[uVar6]);
        if (computeGranularity < 2) {
          computeGranularity = 1;
        }
        break;
      case 'm':
        nonLeafBF = atoi(argv[uVar6]);
        break;
      case 'q':
        nonLeafProb = atof(argv[uVar6]);
        break;
      case 'r':
        rootId = atoi(argv[uVar6]);
        break;
      case 't':
        tVar2 = atoi(argv[uVar6]);
        type = tVar2;
LAB_0010414e:
        iVar1 = -1;
        if (BALANCED < tVar2) {
          iVar1 = (int)uVar5;
        }
        goto LAB_00104127;
      case 'v':
        verbose = atoi(argv[uVar6]);
        break;
      case 'x':
        debug = atoi(argv[uVar6]);
      }
      iVar1 = -1;
LAB_00104127:
      if (iVar1 != -1) {
LAB_00104170:
        if ((int)uVar6 < argc) {
          pcVar4 = argv[(int)uVar6];
        }
        else {
          pcVar4 = "[none]";
        }
        printf("Unrecognized parameter or incorrect/missing value: \'%s %s\'\n",argv[uVar6 - 1],
               pcVar4);
        puts("Try -h for help.");
        impl_abort(4);
        return;
      }
LAB_0010412c:
      uVar5 = uVar5 + 2;
      uVar6 = uVar6 + 2;
    } while (uVar5 < (uint)argc);
  }
  return;
}

Assistant:

void uts_parseParams(int argc, char *argv[]){
  int i = 1; 
  int err = -1;
  while (i < argc && err == -1) {
    if (argv[i][0] == '-' && argv[i][1] == 'h') {
        uts_helpMessage();
        impl_abort(0);

    } else if (argv[i][0] != '-' || strlen(argv[i]) != 2 || argc <= i+1) {
      err = i; break;
    }

    // Matched by implementation -- return 0 on success
    // This is fragile, don't override parameters in impl_parseParam()!
    if (!impl_parseParam(argv[i], argv[i+1])) {
      i += 2;
      continue;
    }

    switch (argv[i][1]) {
      case 'q':
        nonLeafProb = atof(argv[i+1]); break;
      case 'm':
        nonLeafBF = atoi(argv[i+1]); break;
      case 'r':
        rootId = atoi(argv[i+1]); break;
      case 'x':
        debug = atoi(argv[i+1]); break;
      case 'v':
        verbose = atoi(argv[i+1]); break;
      case 't':
        type = (tree_t) atoi(argv[i+1]); 
        if (type != BIN && type != GEO && type!= HYBRID && type != BALANCED) 
	  err = i;
        break;
      case 'a':
        shape_fn = (geoshape_t) atoi(argv[i+1]);
        if (shape_fn > FIXED) err = i;
        break;
      case 'b':
        b_0 = atof(argv[i+1]); break;
      case 'd':
        gen_mx = atoi(argv[i+1]); break;
      case 'f':
        shiftDepth = atof(argv[i+1]); break;
      case 'g':
        computeGranularity = max(1,atoi(argv[i+1])); break;
      default:
        err = i;
    }

    if (err != -1) break;

    i += 2;
  }

  if (err != -1) {
    printf("Unrecognized parameter or incorrect/missing value: '%s %s'\n", argv[i], (i+1 < argc) ? argv[i+1] : "[none]");
    printf("Try -h for help.\n");
    impl_abort(4);
  }
}